

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O1

int str_find_aux(lua_State *L,int find)

{
  char *__s1;
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *__s;
  lua_Integer lVar5;
  TValue *pTVar6;
  char *pcVar7;
  char *pcVar8;
  size_t __n;
  TValue *pTVar9;
  ulong uVar10;
  ulong uVar11;
  char *__s_00;
  size_t l2;
  size_t l1;
  MatchState ms;
  ulong local_260;
  ulong local_258;
  MatchState local_250;
  
  pcVar4 = luaL_checklstring(L,1,&local_258);
  __s = luaL_checklstring(L,2,&local_260);
  lVar5 = luaL_optinteger(L,3,1);
  uVar10 = lVar5 >> 0x3f & local_258 + 1;
  uVar11 = uVar10 + lVar5;
  if (uVar11 == 0 || SCARRY8(uVar10,lVar5) != (long)uVar11 < 0) {
    uVar10 = 0;
  }
  else {
    uVar10 = uVar11 - 1;
    if (local_258 < uVar10) {
      *(undefined4 *)((long)L->top + -4) = 0xffffffff;
      return 1;
    }
  }
  if (find == 0) {
LAB_001447cc:
    cVar1 = *__s;
    local_250.src_end = pcVar4 + local_258;
    uVar10 = 1;
    local_250.src_init = pcVar4;
    local_250.L = L;
    if (1 < (long)uVar11) {
      uVar10 = uVar11;
    }
    do {
      pcVar7 = pcVar4 + (uVar10 - 1);
      local_250.level = 0;
      local_250.depth = 0;
      pcVar8 = match(&local_250,pcVar7,__s + (cVar1 == '^'));
      if (pcVar8 != (char *)0x0) {
        if (find == 0) {
          uVar3 = push_captures(&local_250,pcVar7,pcVar8);
          uVar11 = (ulong)uVar3;
        }
        else {
          L->top->n = (double)(long)uVar10;
          pTVar9 = L->top;
          L->top = pTVar9 + 1;
          if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar9 + 1) {
            lj_state_growstack(L,1);
          }
          L->top->n = (double)((long)pcVar8 - (long)pcVar4);
          pTVar9 = L->top;
          L->top = pTVar9 + 1;
          if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar9 + 1) {
            lj_state_growstack(L,1);
          }
          iVar2 = push_captures(&local_250,(char *)0x0,(char *)0x0);
          uVar11 = (ulong)(iVar2 + 2);
        }
      }
      if (pcVar8 != (char *)0x0) {
        return (int)uVar11;
      }
    } while ((cVar1 != '^') && (uVar10 = uVar10 + 1, pcVar7 < local_250.src_end));
  }
  else {
    pTVar9 = L->top;
    pTVar6 = L->base + 3;
    if (pTVar9 <= pTVar6) {
      pTVar6 = (TValue *)((ulong)(L->glref).ptr32 + 0x68);
    }
    if ((0xfffffffd < (pTVar6->field_2).it) &&
       (pcVar7 = strpbrk(__s,"^$*+?.([%-"), pcVar7 != (char *)0x0)) goto LAB_001447cc;
    pcVar7 = pcVar4 + uVar10;
    if (local_260 != 0) {
      if (local_260 <= local_258 - uVar10) {
        __n = local_260 - 1;
        pcVar8 = (char *)((local_258 - uVar10) - __n);
        if (pcVar8 != (char *)0x0) {
          cVar1 = *__s;
          __s_00 = pcVar7;
          do {
            pcVar7 = (char *)memchr(__s_00,(int)cVar1,(size_t)pcVar8);
            if (pcVar7 == (char *)0x0) break;
            __s1 = pcVar7 + 1;
            iVar2 = bcmp(__s1,__s + 1,__n);
            if (iVar2 == 0) goto LAB_00144985;
            pcVar8 = __s_00 + ((long)pcVar8 - (long)__s1);
            __s_00 = __s1;
          } while (pcVar8 != (char *)0x0);
          pcVar7 = (char *)0x0;
          goto LAB_00144985;
        }
      }
      pcVar7 = (char *)0x0;
    }
LAB_00144985:
    if (pcVar7 != (char *)0x0) {
      pTVar9->n = (double)(long)(pcVar7 + (1 - (long)pcVar4));
      pTVar9 = L->top;
      L->top = pTVar9 + 1;
      if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar9 + 1) {
        lj_state_growstack(L,1);
      }
      L->top->n = (double)(long)(pcVar7 + (local_260 - (long)pcVar4));
      pTVar9 = L->top + 1;
      L->top = pTVar9;
      uVar3 = (L->maxstack).ptr32;
      iVar2 = 2;
      goto LAB_00144a0a;
    }
  }
  (L->top->field_2).it = 0xffffffff;
  pTVar9 = L->top + 1;
  L->top = pTVar9;
  uVar3 = (L->maxstack).ptr32;
  iVar2 = 1;
LAB_00144a0a:
  if ((TValue *)(ulong)uVar3 <= pTVar9) {
    lj_state_growstack(L,1);
  }
  return iVar2;
}

Assistant:

static int str_find_aux(lua_State *L, int find)
{
  size_t l1, l2;
  const char *s = luaL_checklstring(L, 1, &l1);
  const char *p = luaL_checklstring(L, 2, &l2);
  ptrdiff_t init = posrelat(luaL_optinteger(L, 3, 1), l1) - 1;
  if (init < 0) {
    init = 0;
  } else if ((size_t)(init) > l1) {
#if LJ_52
    setnilV(L->top-1);
    return 1;
#else
    init = (ptrdiff_t)l1;
#endif
  }
  if (find && (lua_toboolean(L, 4) ||  /* explicit request? */
      strpbrk(p, SPECIALS) == NULL)) {  /* or no special characters? */
    /* do a plain search */
    const char *s2 = lmemfind(s+init, l1-(size_t)init, p, l2);
    if (s2) {
      lua_pushinteger(L, s2-s+1);
      lua_pushinteger(L, s2-s+(ptrdiff_t)l2);
      return 2;
    }
  } else {
    MatchState ms;
    int anchor = (*p == '^') ? (p++, 1) : 0;
    const char *s1=s+init;
    ms.L = L;
    ms.src_init = s;
    ms.src_end = s+l1;
    do {
      const char *res;
      ms.level = ms.depth = 0;
      if ((res=match(&ms, s1, p)) != NULL) {
	if (find) {
	  lua_pushinteger(L, s1-s+1);  /* start */
	  lua_pushinteger(L, res-s);   /* end */
	  return push_captures(&ms, NULL, 0) + 2;
	} else {
	  return push_captures(&ms, s1, res);
	}
      }
    } while (s1++ < ms.src_end && !anchor);
  }
  lua_pushnil(L);  /* not found */
  return 1;
}